

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  uint8 uVar1;
  uint8 *puVar2;
  uint32 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int value;
  uint32 length;
  uint32 local_3c;
  uint32 local_38;
  Limit local_34;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
    input->buffer_ = puVar2 + 1;
    local_3c = (int)(char)uVar1;
  }
  else {
    bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_3c);
    if (!bVar4) {
      return false;
    }
  }
  local_34 = io::CodedInputStream::PushLimit(input,local_3c);
  while( true ) {
    iVar6 = io::CodedInputStream::BytesUntilLimit(input);
    if (iVar6 < 1) {
      io::CodedInputStream::PopLimit(input,local_34);
      return true;
    }
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
      input->buffer_ = puVar2 + 1;
      bVar4 = true;
      local_38 = (int)(char)uVar1;
    }
    else {
      bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_38);
    }
    uVar3 = local_38;
    if (bVar4 == false) break;
    bVar5 = (*is_valid)(local_38);
    if (bVar5) {
      if (values->current_size_ == values->total_size_) {
        RepeatedField<int>::Reserve(values,values->total_size_ + 1);
      }
      iVar6 = values->current_size_;
      values->current_size_ = iVar6 + 1;
      values->elements_[iVar6] = uVar3;
    }
    if (bVar4 == false) {
      return false;
    }
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}